

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

size_t __thiscall c4::yml::Tree::prev_sibling(Tree *this,size_t node)

{
  NodeData *pNVar1;
  
  pNVar1 = _p(this,node);
  return pNVar1->m_prev_sibling;
}

Assistant:

size_t prev_sibling(size_t node) const { return _p(node)->m_prev_sibling; }